

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O0

void __thiscall OpenMD::Velocitizer::Velocitizer(Velocitizer *this,SimInfo *info)

{
  Globals *pGVar1;
  ForceField *in_RSI;
  SimInfo *in_RDI;
  
  in_RDI->_vptr_SimInfo = (_func_int **)&PTR__Velocitizer_00565c38;
  in_RDI->forceField_ = in_RSI;
  Thermo::Thermo((Thermo *)&in_RDI->simParams_,(SimInfo *)in_RSI);
  pGVar1 = SimInfo::getSimParams((SimInfo *)in_RSI);
  (in_RDI->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pGVar1;
  SimInfo::getRandomNumberGenerator(in_RDI);
  return;
}

Assistant:

Velocitizer::Velocitizer(SimInfo* info) :
      info_(info), thermo_(info), globals_(info->getSimParams()),
      randNumGen_(info->getRandomNumberGenerator()) {}